

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_histogram.cpp
# Opt level: O3

Histogram *
Omega_h::get_histogram
          (Histogram *__return_storage_ptr__,Mesh *mesh,Int dim,Int nbins,Real min_value,
          Real max_value,Reals *values)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int *piVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  LO LVar4;
  promoted_t<signed_char> pVar5;
  pointer psVar6;
  element_type *peVar7;
  size_t sVar8;
  Alloc *pAVar9;
  bool bVar10;
  Bytes marked;
  Read<double> owned_values;
  Bytes floor_marks;
  Alloc *local_138;
  pointer psStack_130;
  Bytes *local_128;
  Real local_120;
  Alloc *local_118;
  element_type *local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  pointer psStack_100;
  Real local_f8;
  Mesh *local_f0;
  Histogram *local_e8;
  vector<long,_std::allocator<long>_> *local_e0;
  pointer local_d8;
  Read<signed_char> local_d0;
  Bytes local_c0;
  Bytes local_b0;
  Read<double> local_a0;
  Read<double> local_90;
  Read<double> local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  element_type *local_48;
  CommPtr local_40;
  
  pAVar9 = (values->write_).shared_alloc_.alloc;
  if (((ulong)pAVar9 & 1) == 0) {
    sVar8 = pAVar9->size;
  }
  else {
    sVar8 = (ulong)pAVar9 >> 3;
  }
  local_120 = min_value;
  local_f8 = max_value;
  local_f0 = mesh;
  LVar4 = Mesh::nents(mesh,dim);
  if (LVar4 != (int)(sVar8 >> 3)) {
    fail("assertion %s failed at %s +%d\n","values.size() == mesh->nents(dim)",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_histogram.cpp"
         ,0x11);
  }
  local_50._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(values->write_).shared_alloc_.alloc;
  if (((ulong)local_50._M_pi & 7) == 0 && (Alloc *)local_50._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(((Alloc *)local_50._M_pi)->size * 8 + 1)
      ;
    }
    else {
      ((Alloc *)local_50._M_pi)->use_count = ((Alloc *)local_50._M_pi)->use_count + 1;
    }
  }
  local_48 = (element_type *)(values->write_).shared_alloc_.direct_ptr;
  Mesh::owned_array<double>
            ((Mesh *)&local_118,(Int)local_f0,(Read<double> *)(ulong)(uint)dim,(Int)&local_50);
  _Var3._M_pi = local_50._M_pi;
  if (((ulong)local_50._M_pi & 7) == 0 && (Alloc *)local_50._M_pi != (Alloc *)0x0) {
    p_Var1 = local_50._M_pi + 3;
    *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_50._M_pi);
      operator_delete(_Var3._M_pi,0x48);
    }
  }
  local_e0 = &__return_storage_ptr__->bins;
  (__return_storage_ptr__->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->min = local_120;
  __return_storage_ptr__->max = local_f8;
  local_e8 = __return_storage_ptr__;
  std::vector<long,_std::allocator<long>_>::resize(local_e0,(long)nbins);
  if (0 < nbins) {
    local_d8 = (pointer)((local_f8 - local_120) / (double)nbins);
    local_58 = (element_type *)(ulong)(nbins - 1);
    local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(uint)nbins;
    peVar7 = (element_type *)0x0;
    local_128 = &local_b0;
    do {
      local_80.write_.shared_alloc_.alloc = local_118;
      if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_80.write_.shared_alloc_.alloc = (Alloc *)(local_118->size * 8 + 1);
        }
        else {
          local_118->use_count = local_118->use_count + 1;
        }
      }
      local_80.write_.shared_alloc_.direct_ptr = local_110;
      each_geq_to<double>((Omega_h *)&local_70,&local_80,
                          (double)(int)peVar7 * (double)local_d8 + local_120);
      pAVar9 = local_80.write_.shared_alloc_.alloc;
      if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
          local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_80.write_.shared_alloc_.alloc + 0x30);
        *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
          operator_delete(pAVar9,0x48);
        }
      }
      local_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      psStack_100 = (pointer)0x0;
      if (peVar7 == local_58) {
        local_90.write_.shared_alloc_.alloc = local_118;
        if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_90.write_.shared_alloc_.alloc = (Alloc *)(local_118->size * 8 + 1);
          }
          else {
            local_118->use_count = local_118->use_count + 1;
          }
        }
        local_90.write_.shared_alloc_.direct_ptr = local_110;
        each_leq_to<double>((Omega_h *)&local_138,&local_90,local_f8);
        local_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138;
        psVar6 = psStack_130;
        pAVar9 = local_90.write_.shared_alloc_.alloc;
        if ((((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) &&
           (entering_parallel == '\x01')) {
          local_138->use_count = local_138->use_count + -1;
          local_108._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138->size * 8 + 1);
        }
      }
      else {
        local_a0.write_.shared_alloc_.alloc = local_118;
        if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_a0.write_.shared_alloc_.alloc = (Alloc *)(local_118->size * 8 + 1);
          }
          else {
            local_118->use_count = local_118->use_count + 1;
          }
        }
        local_a0.write_.shared_alloc_.direct_ptr = local_110;
        each_lt<double>((Omega_h *)&local_138,&local_a0,
                        (double)((int)peVar7 + 1) * (double)local_d8 + local_120);
        local_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138;
        psVar6 = psStack_130;
        pAVar9 = local_a0.write_.shared_alloc_.alloc;
        if ((((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) &&
           (entering_parallel == '\x01')) {
          local_138->use_count = local_138->use_count + -1;
          local_108._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138->size * 8 + 1);
        }
      }
      _Var3._M_pi = local_108._M_pi;
      psStack_130 = (pointer)0x0;
      local_138 = (Alloc *)0x0;
      psStack_100 = psVar6;
      if (((ulong)pAVar9 & 7) == 0 && pAVar9 != (Alloc *)0x0) {
        piVar2 = &pAVar9->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(pAVar9);
          operator_delete(pAVar9,0x48);
        }
      }
      local_b0.write_.shared_alloc_.alloc = (Alloc *)local_70._M_pi;
      if (((ulong)local_70._M_pi & 7) == 0 && (Alloc *)local_70._M_pi != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_b0.write_.shared_alloc_.alloc =
               (Alloc *)((long)(local_70._M_pi)->_vptr__Sp_counted_base * 8 + 1);
        }
        else {
          *(int *)&local_70._M_pi[3]._vptr__Sp_counted_base =
               *(int *)&local_70._M_pi[3]._vptr__Sp_counted_base + 1;
        }
      }
      local_b0.write_.shared_alloc_.direct_ptr = local_68;
      bVar10 = ((ulong)_Var3._M_pi & 7) == 0;
      local_c0.write_.shared_alloc_.alloc = (Alloc *)_Var3._M_pi;
      if (bVar10 && (Alloc *)_Var3._M_pi != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_c0.write_.shared_alloc_.alloc =
               (Alloc *)((long)(_Var3._M_pi)->_vptr__Sp_counted_base * 8 + 1);
        }
        else {
          *(int *)&_Var3._M_pi[3]._vptr__Sp_counted_base =
               *(int *)&_Var3._M_pi[3]._vptr__Sp_counted_base + 1;
        }
      }
      local_c0.write_.shared_alloc_.direct_ptr = psVar6;
      land_each((Omega_h *)&local_138,&local_b0,&local_c0);
      pAVar9 = local_c0.write_.shared_alloc_.alloc;
      if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_c0.write_.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_c0.write_.shared_alloc_.alloc);
          operator_delete(pAVar9,0x48);
        }
      }
      pAVar9 = local_b0.write_.shared_alloc_.alloc;
      if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_b0.write_.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_b0.write_.shared_alloc_.alloc);
          operator_delete(pAVar9,0x48);
        }
      }
      Mesh::comm(local_f0);
      local_d0.write_.shared_alloc_.alloc = local_138;
      if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_d0.write_.shared_alloc_.alloc = (Alloc *)(local_138->size * 8 + 1);
        }
        else {
          local_138->use_count = local_138->use_count + 1;
        }
      }
      local_d0.write_.shared_alloc_.direct_ptr = psStack_130;
      pVar5 = get_sum<signed_char>(&local_40,&local_d0);
      pAVar9 = local_d0.write_.shared_alloc_.alloc;
      (local_e0->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_start[(long)peVar7] = (long)pVar5;
      if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_d0.write_.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_d0.write_.shared_alloc_.alloc);
          operator_delete(pAVar9,0x48);
        }
      }
      if ((element_type *)
          local_40.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pAVar9 = local_138;
      if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
        piVar2 = &local_138->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_138);
          operator_delete(pAVar9,0x48);
        }
      }
      if (bVar10 && (Alloc *)_Var3._M_pi != (Alloc *)0x0) {
        p_Var1 = _Var3._M_pi + 3;
        *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)_Var3._M_pi);
          operator_delete(_Var3._M_pi,0x48);
        }
      }
      _Var3._M_pi = local_70._M_pi;
      if (((ulong)local_70._M_pi & 7) == 0 && (Alloc *)local_70._M_pi != (Alloc *)0x0) {
        p_Var1 = local_70._M_pi + 3;
        *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)local_70._M_pi);
          operator_delete(_Var3._M_pi,0x48);
        }
      }
      peVar7 = (element_type *)((long)&(peVar7->super_Graph).a2ab.write_.shared_alloc_.alloc + 1);
    } while (peVar7 != (element_type *)local_60._M_pi);
  }
  if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
    piVar2 = &local_118->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_118);
      operator_delete(local_118,0x48);
    }
  }
  return local_e8;
}

Assistant:

Histogram get_histogram(Mesh* mesh, Int dim, Int nbins, Real min_value,
    Real max_value, Reals values) {
  OMEGA_H_CHECK(values.size() == mesh->nents(dim));
  auto owned_values = mesh->owned_array(dim, values, 1);
  auto interval = (max_value - min_value) / Real(nbins);
  Histogram histogram;
  histogram.min = min_value;
  histogram.max = max_value;
  histogram.bins.resize(std::size_t(nbins));
  for (Int i = 0; i < nbins; ++i) {
    auto floor = interval * i + min_value;
    auto ceil = interval * (i + 1) + min_value;
    if (i == nbins - 1) ceil = max_value;
    auto floor_marks = each_geq_to(owned_values, floor);
    Read<I8> ceil_marks;
    if (i == nbins - 1)
      ceil_marks = each_leq_to(owned_values, ceil);
    else
      ceil_marks = each_lt(owned_values, ceil);
    auto marked = land_each(floor_marks, ceil_marks);
    histogram.bins[std::size_t(i)] = get_sum(mesh->comm(), marked);
  }
  return histogram;
}